

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
ezc3d::ParametersNS::GroupNS::Parameter::valuesConvertedAsDouble(Parameter *this)

{
  bool bVar1;
  invalid_argument *piVar2;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  int val;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<double,_std::allocator<double>_> *out;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffd8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  
  if (((*(int *)(in_RSI + 0x44) == 1) || (*(int *)(in_RSI + 0x44) == 2)) ||
     (*(int *)(in_RSI + 0x44) == 2)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x167d04);
    std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
    std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff90,
                              (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd8);
      std::vector<double,_std::allocator<double>_>::push_back
                (in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                 &stack0xffffffffffffffd8);
    }
  }
  else {
    if (*(int *)(in_RSI + 0x44) == -1) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"CHAR type cannot be converted to FLOAT");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (*(int *)(in_RSI + 0x44) == 2) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar2,"WORD type cannot be converted to FLOAT");
      __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_ffffffffffffffe0,
               (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffd8._M_current);
  }
  return in_RDI;
}

Assistant:

const std::vector<double>
ezc3d::ParametersNS::GroupNS::Parameter::valuesConvertedAsDouble() const {
  if (_data_type == DATA_TYPE::BYTE || _data_type == DATA_TYPE::INT ||
      _data_type == DATA_TYPE::WORD) {
    std::vector<double> out;
    for (auto val : _param_data_int) {
      out.push_back(static_cast<double>(val));
    }
    return out;
  } else if (_data_type == DATA_TYPE::CHAR) {
    throw std::invalid_argument("CHAR type cannot be converted to FLOAT");
  } else if (_data_type == DATA_TYPE::WORD) {
    throw std::invalid_argument("WORD type cannot be converted to FLOAT");
  }
  return _param_data_double;
}